

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_analyze_inlines(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,int table_mode)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  MD_CTX *unaff_retaddr;
  uint in_stack_00000010;
  int ret;
  MD_SIZE in_stack_0000007c;
  MD_LINE *in_stack_00000080;
  MD_CTX *in_stack_00000088;
  int in_stack_00000110;
  MD_SIZE in_stack_00000114;
  MD_LINE *in_stack_00000118;
  MD_CTX *in_stack_00000120;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  MD_SIZE in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int mark_end;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mark_end = (int)((ulong)in_RSI >> 0x20);
  *(undefined4 *)(in_RDI + 0x98) = 0;
  iVar1 = md_collect_marks(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110);
  if (-1 < iVar1) {
    md_analyze_marks(unaff_retaddr,
                     (MD_LINE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (MD_SIZE)((ulong)in_RDI >> 0x20),(int)in_RDI,mark_end,
                     (MD_CHAR *)CONCAT44(in_EDX,in_ECX),in_stack_00000010);
    iVar1 = md_resolve_links(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
    if (-1 < iVar1) {
      *(undefined4 *)(in_RDI + 0x1d8) = 0xffffffff;
      *(undefined4 *)(in_RDI + 0x1f0) = 0xffffffff;
      *(undefined4 *)(in_RDI + 500) = 0xffffffff;
      if (in_ECX == 0) {
        md_analyze_link_contents
                  ((MD_CTX *)((ulong)in_EDX << 0x20),
                   (MD_LINE *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      else {
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        md_analyze_marks(unaff_retaddr,
                         (MD_LINE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (MD_SIZE)((ulong)in_RDI >> 0x20),(int)in_RDI,mark_end,
                         (MD_CHAR *)CONCAT44(in_EDX,in_ECX),in_stack_00000010);
      }
    }
  }
  return iVar1;
}

Assistant:

static int
md_analyze_inlines(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, int table_mode)
{
    int ret;

    /* Reset the previously collected stack of marks. */
    ctx->n_marks = 0;

    /* Collect all marks. */
    MD_CHECK(md_collect_marks(ctx, lines, n_lines, table_mode));

    /* (1) Links. */
    md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("[]!"), 0);
    MD_CHECK(md_resolve_links(ctx, lines, n_lines));
    BRACKET_OPENERS.top = -1;
    ctx->unresolved_link_head = -1;
    ctx->unresolved_link_tail = -1;

    if(table_mode) {
        /* (2) Analyze table cell boundaries. */
        MD_ASSERT(n_lines == 1);
        ctx->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("|"), 0);
        return ret;
    }

    /* (3) Emphasis and strong emphasis; permissive autolinks. */
    md_analyze_link_contents(ctx, lines, n_lines, 0, ctx->n_marks);

abort:
    return ret;
}